

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.cc
# Opt level: O2

Ptr __thiscall core::image::float_to_byte_image(image *this,ConstPtr *image,float vmin,float vmax)

{
  element_type *peVar1;
  pointer pfVar2;
  int i;
  long lVar3;
  invalid_argument *this_00;
  float fVar4;
  Ptr PVar5;
  
  if ((image->super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      (element_type *)0x0) {
    Image<unsigned_char>::create();
    peVar1 = (image->super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    TypedImageBase<unsigned_char>::allocate
              (*(TypedImageBase<unsigned_char> **)this,
               (peVar1->super_TypedImageBase<float>).super_ImageBase.w,
               (peVar1->super_TypedImageBase<float>).super_ImageBase.h,
               (peVar1->super_TypedImageBase<float>).super_ImageBase.c);
    lVar3 = 0;
    while( true ) {
      peVar1 = (image->super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      pfVar2 = (peVar1->super_TypedImageBase<float>).data.
               super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
               _M_start;
      PVar5.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              (long)(int)((ulong)((long)*(pointer *)
                                         ((long)&(peVar1->super_TypedImageBase<float>).data.
                                                 super__Vector_base<float,_std::allocator<float>_>.
                                                 _M_impl.super__Vector_impl_data + 8) - (long)pfVar2
                                 ) >> 2);
      if ((long)PVar5.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi <= lVar3) break;
      fVar4 = pfVar2[lVar3];
      if (fVar4 <= vmin) {
        fVar4 = vmin;
      }
      if (vmax <= fVar4) {
        fVar4 = vmax;
      }
      *(char *)(*(long *)(*(long *)this + 0x18) + lVar3) =
           (char)(int)(((fVar4 - vmin) * 255.0) / (vmax - vmin) + 0.5);
      lVar3 = lVar3 + 1;
    }
    PVar5.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (Ptr)PVar5.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Null image given");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

ByteImage::Ptr
float_to_byte_image (FloatImage::ConstPtr image, float vmin, float vmax)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    ByteImage::Ptr img = ByteImage::create();
    img->allocate(image->width(), image->height(), image->channels());
    for (int i = 0; i < image->get_value_amount(); ++i)
    {
        float value = std::min(vmax, std::max(vmin, image->at(i)));
        value = 255.0f * (value - vmin) / (vmax - vmin);
        img->at(i) = static_cast<uint8_t>(value + 0.5f);
    }
    return img;
}